

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeSelect(OptimizeInstructions *this,Select *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 uVar4;
  matched_t<wasm::Const_*> pCVar5;
  Expression *pEVar6;
  Expression *b;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  matcher;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  matcher_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [48];
  undefined1 auVar9 [48];
  Matcher<wasm::Match::Internal::ExactKind<int>_> MVar10;
  undefined8 uVar11;
  undefined1 auVar12 [8];
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> pBVar13;
  bool bVar14;
  bool bVar15;
  BinaryOp BVar16;
  Index IVar17;
  uint uVar18;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted_2;
  Expression *pEVar19;
  Unary *pUVar20;
  Block *pBVar21;
  undefined1 auVar22 [8];
  Drop *pDVar23;
  long lVar24;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted_3;
  undefined8 *puVar25;
  undefined8 *puVar26;
  Block *unaff_R12;
  matched_t<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> casted;
  byte bVar27;
  Builder BVar28;
  bool bVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  undefined8 in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa18;
  undefined8 local_5d8 [2];
  undefined8 local_5c8;
  undefined1 local_5b8 [16];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_590;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  *local_580;
  undefined1 local_570 [16];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_548;
  undefined1 local_520 [40];
  undefined1 *local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined1 local_4b8 [8];
  Type type;
  bool local_3c8;
  undefined8 uStack_340;
  undefined8 uStack_320;
  undefined8 uStack_310;
  undefined8 uStack_2f0;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_2d8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  Const *c_1;
  undefined1 local_298 [16];
  Matcher<wasm::Match::Internal::ExactKind<int>_> local_288;
  bool local_1b8;
  undefined1 local_138 [8];
  int32_t cond;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_128;
  undefined1 local_f0 [8];
  Expression *c;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e0;
  Type local_d0;
  pointer local_c8;
  undefined1 local_a8 [8];
  Expression *x_1;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_98;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> local_60;
  Expression *x;
  Block *local_50;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> local_48;
  Expression *y;
  Builder builder;
  
  local_288._12_4_ = SUB84((ulong)local_288.binder >> 0x20,0);
  bVar30 = 0;
  y = (Expression *)
      (this->
      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
      ).
      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
      .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
      currModule;
  pEVar19 = optimizeBoolean(this,curr->condition);
  curr->condition = pEVar19;
  local_298._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_288._0_12_ = ZEXT812(0);
  local_2a8 = (undefined1  [8])0x0;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId) {
    unaff_R12 = (Block *)curr->ifTrue;
    bVar14 = Match::Internal::MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>::
             operator()((MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)local_4b8,
                        (Expression *)unaff_R12,this);
    if ((!bVar14) ||
       (pCVar5 = (matched_t<wasm::Const_*>)curr->condition,
       (pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
       ) goto LAB_0080f341;
    local_50 = (Block *)curr->ifFalse;
    if (local_2a8 != (undefined1  [8])0x0) {
      ((HeapType *)local_2a8)->id = (uintptr_t)pCVar5;
    }
    Literal::Literal((Literal *)local_4b8,&pCVar5->value);
    bVar14 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                        *)local_298,(Literal *)local_4b8);
    Literal::~Literal((Literal *)local_4b8);
    uVar11 = local_288._8_8_;
    if (!bVar14) goto LAB_0080f341;
    bVar27 = 0;
    local_288._8_8_ = uVar11;
  }
  else {
LAB_0080f341:
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_288._0_12_ = ZEXT812(0);
    local_2a8 = (undefined1  [8])0x0;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
    {
      unaff_R12 = (Block *)curr->ifTrue;
      if (curr->condition->_id == ConstId) {
        pEVar19 = curr->ifFalse;
        builder.wasm = (Module *)this;
        Literal::Literal((Literal *)local_4b8,(Literal *)(curr->condition + 1));
        bVar14 = Match::Internal::
                 Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                 ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                            *)local_298,(Literal *)local_4b8);
        Literal::~Literal((Literal *)local_4b8);
        this = (OptimizeInstructions *)builder;
        if (bVar14) {
          pDVar23 = (Drop *)MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x18,8);
          (pDVar23->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (pDVar23->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          pDVar23->value = (Expression *)unaff_R12;
          Drop::finalize(pDVar23);
          pBVar21 = Builder::makeBlock((Builder *)&y,(Expression *)pDVar23);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar21->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar19);
          local_50 = pBVar21;
          Block::finalize(pBVar21);
          bVar27 = 0;
          this = (OptimizeInstructions *)builder;
          goto LAB_0080f4e9;
        }
      }
    }
    bVar14 = false;
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_288.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)local_138;
    local_2a8 = (undefined1  [8])0x0;
    local_50 = unaff_R12;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
    {
      local_50 = (Block *)curr->ifTrue;
      bVar14 = Match::Internal::MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>::
               operator()((MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)local_4b8
                          ,curr->ifFalse,this);
      if (bVar14) {
        pCVar5 = (matched_t<wasm::Const_*>)curr->condition;
        bVar14 = false;
        if ((pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
            ConstId) {
          if (local_2a8 != (undefined1  [8])0x0) {
            ((HeapType *)local_2a8)->id = (uintptr_t)pCVar5;
          }
          Literal::Literal((Literal *)local_4b8,&pCVar5->value);
          bVar14 = Match::Internal::
                   Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>
                   ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>
                              *)local_298,(Literal *)local_4b8);
          Literal::~Literal((Literal *)local_4b8);
        }
      }
      else {
        bVar14 = false;
      }
    }
    if ((bVar14 != false) && (local_138._0_4_ == 0)) {
      __assert_fail("cond != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0xa1f,"Expression *wasm::OptimizeInstructions::optimizeSelect(Select *)");
    }
    bVar27 = bVar14 ^ 1;
  }
LAB_0080f4e9:
  if (bVar27 == 0) {
    return (Expression *)local_50;
  }
  local_298._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_288._0_12_ = ZEXT812(0);
  local_2a8 = (undefined1  [8])0x0;
  builder.wasm = (Module *)this;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId) {
    local_60 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
               curr->ifTrue;
    if (curr->ifFalse->_id != ConstId) goto LAB_0080f597;
    Literal::Literal((Literal *)local_4b8,(Literal *)(curr->ifFalse + 1));
    bVar14 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                        *)local_298,(Literal *)local_4b8);
    Literal::~Literal((Literal *)local_4b8);
    if (!bVar14) goto LAB_0080f597;
    local_48 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
               curr->condition;
    bVar14 = areConsecutiveInputsEqualAndFoldable
                       ((OptimizeInstructions *)builder.wasm,(Expression *)local_60,
                        (Expression *)local_48);
    if (!bVar14) goto LAB_0080f597;
    auVar22 = (undefined1  [8])curr->ifTrue;
LAB_0080f735:
    bVar14 = false;
    BVar28.wasm = builder.wasm;
  }
  else {
LAB_0080f597:
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_288._0_12_ = ZEXT812(0);
    local_2a8 = (undefined1  [8])0x0;
    if (((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId
        ) && (curr->ifTrue->_id == ConstId)) {
      Literal::Literal((Literal *)local_4b8,(Literal *)(curr->ifTrue + 1));
      bVar14 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                          *)local_298,(Literal *)local_4b8);
      Literal::~Literal((Literal *)local_4b8);
      if (bVar14) {
        local_60 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                    )curr->ifFalse;
        local_48 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                    )curr->condition;
        bVar14 = areConsecutiveInputsEqualAndFoldable
                           ((OptimizeInstructions *)builder.wasm,(Expression *)local_60,
                            (Expression *)local_48);
        pBVar13 = local_60;
        if (bVar14) {
          pDVar23 = (Drop *)MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x18,8);
          (pDVar23->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (pDVar23->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          pDVar23->value = (Expression *)pBVar13;
          Drop::finalize(pDVar23);
          pEVar19 = curr->ifTrue;
          auVar22 = (undefined1  [8])Builder::makeBlock((Builder *)&y,(Expression *)pDVar23);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(((Block *)auVar22)->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar19);
          Block::finalize((Block *)auVar22);
          goto LAB_0080f735;
        }
      }
    }
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_2a8 = (undefined1  [8])0x0;
    local_288.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
    local_288.data = 0;
    local_288._12_4_ = 0;
    local_548.binder = &local_48;
    local_590.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
    local_590._8_4_ = 0x15;
    local_4b8 = (undefined1  [8])0x0;
    local_580 = &local_548;
    bVar14 = Match::Internal::
             Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
             ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                        *)local_4b8,(candidate_t<wasm::Select_*>)curr);
    if (bVar14) {
LAB_0080f70b:
      bVar14 = areConsecutiveInputsEqualAndFoldable
                         ((OptimizeInstructions *)builder.wasm,(Expression *)local_60,
                          (Expression *)local_48);
      if (bVar14) {
        auVar22 = (undefined1  [8])(&curr->ifTrue)[curr->condition->_id == UnaryId];
        goto LAB_0080f735;
      }
    }
    else {
      local_98.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_520;
      local_520._0_8_ = &local_60;
      local_4b8 = (undefined1  [8])0x0;
      local_e0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2b8;
      local_2b8._0_8_ = &local_48;
      local_e0.func.super_IString.str._M_str = local_138;
      local_128.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)0x0;
      local_138 = (undefined1  [8])0x0;
      local_128.next.next =
           (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            )0x0;
      local_98.next.next.curr =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
            *)local_f0;
      local_f0 = (undefined1  [8])0x0;
      c._0_4_ = 0x29;
      local_a8 = (undefined1  [8])0x0;
      local_98.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_4b8;
      if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
          SelectId) {
        local_60 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                    )curr->ifTrue;
        bVar14 = Match::Internal::
                 Components<wasm::Select_*,_1,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                 ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                               *)&local_98.next);
        if (bVar14) goto LAB_0080f70b;
      }
    }
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_2a8 = (undefined1  [8])0x0;
    local_288.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
    local_288.data = 0;
    local_288._12_4_ = 0;
    local_548.binder = &local_48;
    local_590.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
    local_590._8_4_ = 0x15;
    local_4b8 = (undefined1  [8])0x0;
    local_580 = &local_548;
    bVar14 = Match::Internal::
             Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
             ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                        *)local_4b8,(candidate_t<wasm::Select_*>)curr);
    BVar28 = builder;
    auVar22 = (undefined1  [8])local_50;
    if (bVar14) {
LAB_0080f861:
      bVar29 = areConsecutiveInputsEqualAndFoldable
                         ((OptimizeInstructions *)BVar28.wasm,(Expression *)local_60,
                          (Expression *)local_48);
      pBVar13 = local_60;
      bVar14 = true;
      if (bVar29) {
        pDVar23 = (Drop *)MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x18,8);
        (pDVar23->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar23->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar23->value = (Expression *)pBVar13;
        Drop::finalize(pDVar23);
        BVar28 = builder;
        pEVar19 = (&curr->ifTrue)[curr->condition->_id == UnaryId];
        auVar22 = (undefined1  [8])Builder::makeBlock((Builder *)&y,(Expression *)pDVar23);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(((Block *)auVar22)->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar19);
        Block::finalize((Block *)auVar22);
        bVar14 = false;
      }
    }
    else {
      local_4b8 = (undefined1  [8])0x0;
      local_98.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_520;
      local_520._0_8_ = &local_60;
      local_e0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2b8;
      local_2b8._0_8_ = &local_48;
      local_e0.func.super_IString.str._M_str = local_138;
      local_128.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)0x0;
      local_138 = (undefined1  [8])0x0;
      local_128.next.next =
           (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            )0x0;
      local_128.next.next._8_8_ = 0;
      local_98.next.next.curr =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
            *)local_f0;
      local_f0 = (undefined1  [8])0x0;
      c._0_4_ = 0x29;
      local_a8 = (undefined1  [8])0x0;
      local_98.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_4b8;
      if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
          SelectId) {
        bVar14 = Match::Internal::
                 Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                 ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                               *)&local_98);
        if (bVar14) goto LAB_0080f861;
      }
      bVar14 = true;
    }
  }
  if (!bVar14) {
    return (Expression *)(Block *)auVar22;
  }
  bVar14 = false;
  local_128.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_2a8;
  local_298._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2a8 = (undefined1  [8])0x0;
  local_288.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
  local_288.data = 0;
  local_288._12_4_ = 0;
  local_4b8 = (undefined1  [8])0x0;
  local_a8 = (undefined1  [8])local_f0;
  local_128.next.next.curr =
       (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_a8;
  local_138 = (undefined1  [8])0x0;
  local_128.next.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_4b8;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId) {
    bVar14 = Match::Internal::
             Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
             ::match(curr,&local_128);
  }
  if (bVar14 == false) {
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_288 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(ZEXT816(1) << 0x40);
    local_2a8 = (undefined1  [8])0x0;
    local_4b8 = (undefined1  [8])0x0;
    local_138 = (undefined1  [8])0x0;
    local_128.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_2a8;
    local_128.next.next.curr =
         (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_a8;
    local_a8 = (undefined1  [8])local_f0;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
    {
      local_128.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_4b8;
      bVar15 = Match::Internal::
               Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
               ::match(curr,&local_128);
      bVar29 = true;
      if (bVar15) goto LAB_0080fa22;
    }
    else {
      bVar29 = true;
      local_128.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_4b8;
    }
  }
  else {
LAB_0080fa22:
    auVar22 = local_f0;
    if (bVar14 != false) {
      pUVar20 = (Unary *)MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x20,8);
      BVar28 = builder;
      (pUVar20->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
      (pUVar20->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
      pUVar20->op = EqZInt32;
      pUVar20->value = (Expression *)auVar22;
      Unary::finalize(pUVar20);
      local_f0 = (undefined1  [8])
                 optimizeBoolean((OptimizeInstructions *)BVar28.wasm,(Expression *)pUVar20);
    }
    iVar3 = *(int *)local_f0;
    if (iVar3 < 0x2c) {
      if (iVar3 == 0xf) {
        bVar14 = Unary::isRelational((Unary *)local_f0);
      }
      else {
        if (iVar3 != 0x10) {
          if (iVar3 != 0x2a) goto LAB_0080fb7e;
          goto LAB_0080fc09;
        }
        bVar14 = Binary::isRelational((Binary *)local_f0);
      }
LAB_0080fb76:
      if (bVar14 == false) {
LAB_0080fb7e:
        auVar22 = local_f0;
        pUVar20 = (Unary *)MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x20,8);
        (pUVar20->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId
        ;
        (pUVar20->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
        pUVar20->op = EqZInt32;
        pUVar20->value = (Expression *)auVar22;
        Unary::finalize(pUVar20);
        pBVar21 = (Block *)MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x20,8);
        (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
        (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
        *(undefined4 *)&(pBVar21->name).super_IString.str._M_len = 0x14;
        (pBVar21->name).super_IString.str._M_str = (char *)pUVar20;
        Unary::finalize((Unary *)pBVar21);
        BVar28 = builder;
        local_f0 = (undefined1  [8])pBVar21;
      }
    }
    else if ((iVar3 != 0x2c) && (iVar3 != 0x39)) {
      if (iVar3 == 0x4e) {
        bVar14 = (int)(((Name *)((long)local_f0 + 0x10))->super_IString).str._M_len == 0;
        goto LAB_0080fb76;
      }
      goto LAB_0080fb7e;
    }
LAB_0080fc09:
    auVar12 = local_f0;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id == 3) {
      auVar22 = (undefined1  [8])MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x20,8);
      (((Block *)auVar22)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id =
           UnaryId;
      (((Block *)auVar22)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
      id = 0;
      *(undefined4 *)&(((Block *)auVar22)->name).super_IString.str._M_len = 0x17;
      (((Block *)auVar22)->name).super_IString.str._M_str = (char *)auVar12;
      Unary::finalize((Unary *)auVar22);
      bVar29 = false;
    }
    else {
      bVar29 = false;
      auVar22 = local_f0;
    }
  }
  if (!bVar29) {
    return (Expression *)(Block *)auVar22;
  }
  pEVar19 = curr->condition;
  if ((pEVar19->_id == BinaryId) &&
     (BVar16 = invertBinaryOp((OptimizeInstructions *)BVar28.wasm,pEVar19[1]._id),
     BVar16 != InvalidBinary)) {
    local_50 = (Block *)CONCAT44(local_50._4_4_,BVar16);
    local_2a8 = (undefined1  [8])0x0;
    local_298._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_288.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
    local_288.data = 0;
    local_288._12_4_ = 0;
    MVar10 = local_288;
    local_288._8_8_ = 0;
    if (curr->ifTrue->_id == ConstId) {
      local_288 = MVar10;
      Literal::Literal((Literal *)local_4b8,(Literal *)(curr->ifTrue + 1));
      bVar14 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)local_298,(Literal *)local_4b8);
      Literal::~Literal((Literal *)local_4b8);
      if (!bVar14) goto LAB_0080fd1f;
      pEVar6 = curr->ifFalse;
      local_5c8 = 0;
      local_5d8[0] = 0;
      local_5b8 = (undefined1  [16])0x0;
      puVar25 = local_5d8;
      puVar26 = (undefined8 *)&stack0xfffffffffffff9d8;
      for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar26 = *puVar25;
        puVar25 = puVar25 + (ulong)bVar30 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
      }
      matcher_00._8_8_ = in_stack_fffffffffffff9e0;
      matcher_00.binder = (matched_t<wasm::Const_*> *)in_stack_fffffffffffff9d8;
      matcher_00.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
           in_stack_fffffffffffff9e8;
      matcher_00.submatchers.curr._8_8_ = in_stack_fffffffffffff9f0;
      matcher_00.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::ExactKind<long>_> *)in_stack_fffffffffffff9f8;
      matcher_00.submatchers.curr.submatchers.curr.data = in_stack_fffffffffffffa00;
      matcher_00.submatchers.curr.submatchers.curr._16_8_ = in_stack_fffffffffffffa08;
      matcher_00.submatchers.curr.submatchers._24_8_ = in_stack_fffffffffffffa10;
      matcher_00.submatchers._48_8_ = in_stack_fffffffffffffa18;
      bVar14 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                         (pEVar6,matcher_00);
      if (bVar14) goto LAB_0080fd1f;
    }
    else {
LAB_0080fd1f:
      local_2a8 = (undefined1  [8])0x0;
      local_298._0_8_ =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_288._8_8_;
      local_288 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(auVar7 << 0x40);
      if (curr->ifTrue->_id == ConstId) {
        Literal::Literal((Literal *)local_4b8,(Literal *)(curr->ifTrue + 1));
        bVar14 = Match::Internal::
                 Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                 ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                            *)local_298,(Literal *)local_4b8);
        Literal::~Literal((Literal *)local_4b8);
        if (bVar14) goto LAB_0080fe00;
      }
      local_4e8 = 0;
      local_4d8 = 0;
      local_4f8 = local_2a8;
      matcher._8_8_ = uStack_4f0;
      matcher.binder = (matched_t<wasm::Const_*> *)local_4f8;
      matcher.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      matcher.submatchers.curr._8_8_ = uStack_4e0;
      matcher.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
      matcher.submatchers.curr.submatchers.curr._8_8_ = uStack_4d0;
      matcher.submatchers.curr.submatchers._16_8_ = local_4c8;
      matcher.submatchers._40_8_ = uStack_4c0;
      bVar14 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                         (curr->ifFalse,matcher);
      if ((!bVar14) ||
         (bVar14 = Literal::isZero((((Literals *)((long)local_2a8 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar14))
      goto LAB_0080fe00;
    }
    pEVar19[1]._id = (Id)local_50;
    uVar1 = curr->ifTrue;
    uVar2 = curr->ifFalse;
    auVar31._8_4_ = (int)uVar1;
    auVar31._0_8_ = uVar2;
    auVar31._12_4_ = (int)((ulong)uVar1 >> 0x20);
    curr->ifTrue = (Expression *)uVar2;
    curr->ifFalse = (Expression *)auVar31._8_8_;
  }
LAB_0080fe00:
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id == 2) {
    IVar17 = Bits::getMaxBits<wasm::OptimizeInstructions>
                       (curr->condition,(OptimizeInstructions *)BVar28.wasm);
    if (((IVar17 < 2) &&
        (IVar17 = Bits::getMaxBits<wasm::OptimizeInstructions>
                            (curr->ifTrue,(OptimizeInstructions *)BVar28.wasm), IVar17 < 2)) &&
       (IVar17 = Bits::getMaxBits<wasm::OptimizeInstructions>
                           (curr->ifFalse,(OptimizeInstructions *)BVar28.wasm), IVar17 < 2)) {
      local_4b8 = (undefined1  [8])local_f0;
      local_298._0_8_ =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_2a8 = (undefined1  [8])0x0;
      local_288.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
      local_288.data = 0;
      local_288._12_4_ = 0;
      auVar8._8_8_ = local_4b8;
      auVar8._0_8_ = uStack_340;
      auVar8._16_8_ = local_2a8;
      auVar8._24_8_ = local_138;
      auVar8._32_8_ = uStack_320;
      auVar8._40_8_ = 0;
      local_138 = (undefined1  [8])local_a8;
      bVar14 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                           )(auVar8 << 0x40));
      if (bVar14) {
        auVar22 = (undefined1  [8])
                  Builder::makeBinary((Builder *)&y,AndInt32,(Expression *)local_f0,
                                      (Expression *)local_a8);
        bVar14 = false;
      }
      else {
        local_298._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
        local_288 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(ZEXT816(1) << 0x40);
        local_2a8 = (undefined1  [8])0x0;
        local_4b8 = (undefined1  [8])local_f0;
        auVar9._8_8_ = local_2a8;
        auVar9._0_8_ = uStack_310;
        auVar9._16_8_ = local_4b8;
        auVar9._24_8_ = local_138;
        auVar9._32_8_ = uStack_2f0;
        auVar9._40_8_ = 0;
        local_138 = (undefined1  [8])local_a8;
        bVar29 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                             )(auVar9 << 0x40));
        bVar14 = true;
        if (bVar29) {
          auVar22 = (undefined1  [8])
                    Builder::makeBinary((Builder *)&y,OrInt32,(Expression *)local_f0,
                                        (Expression *)local_a8);
          bVar14 = false;
        }
      }
      if (!bVar14) {
        return (Expression *)(Block *)auVar22;
      }
    }
  }
  local_298._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_288 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(ZEXT816(0xffffffffffffffff) << 0x40)
  ;
  local_98.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_2a8;
  local_2a8 = (undefined1  [8])0x0;
  local_4b8 = (undefined1  [8])0x0;
  local_548.submatchers.curr =
       (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_2b8;
  local_2b8._0_8_ = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
  local_548.submatchers.next.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_138;
  local_128.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)0x0;
  local_138 = (undefined1  [8])0x0;
  local_128.next.next =
       (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
        )0x0;
  local_98.next.next.curr = &local_548;
  local_548.data = LtS;
  local_a8 = (undefined1  [8])0x0;
  local_98.next.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_4b8;
  local_548.binder = &local_48;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id != SelectId)
     || (bVar14 = Match::Internal::
                  Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                  ::match(curr,&local_98), !bVar14)) {
    bVar14 = false;
    local_98.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)0x0;
    local_98.next.next.curr =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)0x0;
    local_98.next.next._8_8_ = 1;
    local_a8 = (undefined1  [8])0x0;
    local_e0.i64 = 0;
    local_d0.id = 0;
    local_c8 = (pointer)0xffffffffffffffff;
    local_f0 = (undefined1  [8])0x0;
    local_520._16_8_ = &local_60;
    local_60 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
               0x0;
    local_520._24_8_ = &local_590;
    local_580 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                 *)0x0;
    local_590.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
    local_570 = (undefined1  [16])0x0;
    local_2d8.next.next.curr =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)local_520;
    local_520._8_4_ = 0x1c;
    local_2d8.next.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_f0;
    local_520._0_8_ = &local_48;
    local_2d8.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_a8;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
    {
      bVar14 = Match::Internal::
               Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
               ::match(curr,&local_2d8);
    }
    bVar29 = true;
    if (bVar14 == false) goto LAB_008101c3;
  }
  pEVar19 = local_48->right;
  if (pEVar19->_id == ConstId) {
    local_4b8 = (undefined1  [8])(curr->ifTrue->type).id;
    bVar29 = local_4b8 != (undefined1  [8])(pEVar19->type).id;
    if (bVar29) {
LAB_008101c3:
      if (bVar29) {
        bVar14 = true;
        if ((((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
              SelectId) && (pEVar19 = curr->condition, pEVar19->_id == UnaryId)) &&
           (pEVar19[1]._id == MemorySizeId)) {
          pEVar6 = curr->ifTrue;
          b = curr->ifFalse;
          local_50 = (Block *)pEVar19[1].type.id;
          bVar29 = EffectAnalyzer::canReorder
                             ((PassOptions *)
                              (((builder.wasm)->exports).
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 6),
                              (Module *)
                              ((builder.wasm)->debugInfoFileNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar6,b);
          if (bVar29) {
            curr->ifTrue = b;
            curr->ifFalse = pEVar6;
            curr->condition = (Expression *)local_50;
            bVar14 = false;
            auVar22 = (undefined1  [8])curr;
          }
        }
        BVar28.wasm = builder.wasm;
        if (bVar14) {
          if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
              SelectId) {
            pBVar21 = (Block *)curr->ifTrue;
            pEVar19 = curr->condition;
            bVar14 = ExpressionAnalyzer::equal((Expression *)pBVar21,curr->ifFalse);
            if (bVar14) {
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)local_2a8,
                         (PassOptions *)
                         (((BVar28.wasm)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 6),
                         (Module *)
                         ((BVar28.wasm)->debugInfoFileNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression *)pBVar21);
              if ((local_1b8 != false) ||
                 (bVar14 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_2a8),
                 bVar14)) {
                pBVar21 = (Block *)0x0;
              }
              else {
                EffectAnalyzer::EffectAnalyzer
                          ((EffectAnalyzer *)local_4b8,
                           (PassOptions *)
                           (((BVar28.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 6),
                           (Module *)
                           ((BVar28.wasm)->debugInfoFileNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar19);
                if ((local_3c8 != false) ||
                   (bVar14 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_4b8),
                   bVar14)) {
                  bVar14 = EffectAnalyzer::invalidates
                                     ((EffectAnalyzer *)local_4b8,(EffectAnalyzer *)local_2a8);
                  if (bVar14) {
                    pBVar21 = (Block *)0x0;
                  }
                  else {
                    pDVar23 = Builder::makeDrop((Builder *)&y,pEVar19);
                    pBVar21 = Builder::makeSequence
                                        ((Builder *)&y,(Expression *)pDVar23,(Expression *)pBVar21);
                  }
                }
                EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_4b8);
              }
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2a8);
              return (Expression *)pBVar21;
            }
          }
          auVar22 = (undefined1  [8])0x0;
        }
      }
      return (Expression *)(Block *)auVar22;
    }
    (local_48->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
         (uintptr_t)local_4b8;
    if ((ulong)local_4b8 < 7) {
      local_48->op = *(BinaryOp *)(&DAT_00b8f060 + (long)local_4b8 * 4);
      uVar18 = wasm::Type::getByteSize((Type *)local_4b8);
      Literal::makeFromInt32((Literal *)local_2a8,uVar18 * 8 + -1,(Type)local_4b8);
      Literal::operator=((Literal *)(pEVar19 + 1),(Literal *)local_2a8);
      Literal::~Literal((Literal *)local_2a8);
      Literal::makeOne((Literal *)local_2a8,(Type)local_4b8);
      if (curr->ifTrue->_id != ConstId) goto LAB_00810436;
      Literal::operator=((Literal *)(curr->ifTrue + 1),(Literal *)local_2a8);
      Literal::~Literal((Literal *)local_2a8);
      pBVar13 = local_48;
      if ((ulong)local_4b8 < 7) {
        uVar4 = *(undefined4 *)(&DAT_00b8f07c + (long)local_4b8 * 4);
        pEVar19 = curr->ifTrue;
        auVar22 = (undefined1  [8])MixedArena::allocSpace((MixedArena *)&y[0x15].type,0x28,8);
        (((Block *)auVar22)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id
             = BinaryId;
        (((Block *)auVar22)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
        type.id = 0;
        *(undefined4 *)&(((Block *)auVar22)->name).super_IString.str._M_len = uVar4;
        (((Block *)auVar22)->name).super_IString.str._M_str = (char *)pBVar13;
        (((Block *)auVar22)->list).
        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
             (Expression **)pEVar19;
        Binary::finalize((Binary *)auVar22);
        goto LAB_008101c3;
      }
    }
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
LAB_00810436:
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
}

Assistant:

Expression* optimizeSelect(Select* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    curr->condition = optimizeBoolean(curr->condition);
    {
      // Constant condition, we can just pick the correct side (barring side
      // effects)
      Expression *ifTrue, *ifFalse;
      if (matches(curr, select(pure(&ifTrue), any(&ifFalse), i32(0)))) {
        return ifFalse;
      }
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), i32(0)))) {
        return builder.makeSequence(builder.makeDrop(ifTrue), ifFalse);
      }
      int32_t cond;
      if (matches(curr, select(any(&ifTrue), pure(&ifFalse), i32(&cond)))) {
        // The condition must be non-zero because a zero would have matched one
        // of the previous patterns.
        assert(cond != 0);
        return ifTrue;
      }
      // Don't bother when `ifFalse` isn't pure - we would need to reverse the
      // order using a temp local, which would be bad
    }
    {
      // TODO: Remove this after landing SCCP pass. See: #4161

      // i32(x) ? i32(x) : 0  ==>  x
      Expression *x, *y;
      if (matches(curr, select(any(&x), i32(0), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->ifTrue;
      }
      // i32(x) ? 0 : i32(x)  ==>  { x, 0 }
      if (matches(curr, select(i32(0), any(&x), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(builder.makeDrop(x), curr->ifTrue);
      }

      // i64(x) == 0 ? 0 : i64(x)  ==>  x
      // i64(x) != 0 ? i64(x) : 0  ==>  x
      if ((matches(curr, select(i64(0), any(&x), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(any(&x), i64(0), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue;
      }

      // i64(x) == 0 ? i64(x) : 0  ==>  { x, 0 }
      // i64(x) != 0 ? 0 : i64(x)  ==>  { x, 0 }
      if ((matches(curr, select(any(&x), i64(0), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(i64(0), any(&x), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(
          builder.makeDrop(x),
          curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue);
      }
    }
    {
      // Simplify selects between 0 and 1
      Expression* c;
      bool reversed = matches(curr, select(ival(0), ival(1), any(&c)));
      if (reversed || matches(curr, select(ival(1), ival(0), any(&c)))) {
        if (reversed) {
          c = optimizeBoolean(builder.makeUnary(EqZInt32, c));
        }
        if (!Properties::emitsBoolean(c)) {
          // cond ? 1 : 0 ==> !!cond
          c = builder.makeUnary(EqZInt32, builder.makeUnary(EqZInt32, c));
        }
        return curr->type == Type::i64 ? builder.makeUnary(ExtendUInt32, c) : c;
      }
    }
    // Flip the arms if doing so might help later optimizations here.
    if (auto* binary = curr->condition->dynCast<Binary>()) {
      auto inv = invertBinaryOp(binary->op);
      if (inv != InvalidBinary) {
        // For invertible binary operations, we prefer to have non-zero values
        // in the ifTrue, and zero values in the ifFalse, due to the
        // optimization right after us. Even if this does not help there, it is
        // a nice canonicalization. (To ensure convergence - that we don't keep
        // doing work each time we get here - do nothing if both are zero, or
        // if both are nonzero.)
        Const* c;
        if ((matches(curr->ifTrue, ival(0)) &&
             !matches(curr->ifFalse, ival(0))) ||
            (!matches(curr->ifTrue, ival()) &&
             matches(curr->ifFalse, ival(&c)) && !c->value.isZero())) {
          binary->op = inv;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
    }
    if (curr->type == Type::i32 &&
        Bits::getMaxBits(curr->condition, this) <= 1 &&
        Bits::getMaxBits(curr->ifTrue, this) <= 1 &&
        Bits::getMaxBits(curr->ifFalse, this) <= 1) {
      // The condition and both arms are i32 booleans, which allows us to do
      // boolean optimizations.
      Expression* x;
      Expression* y;

      // x ? y : 0   ==>   x & y
      if (matches(curr, select(any(&y), ival(0), any(&x)))) {
        return builder.makeBinary(AndInt32, y, x);
      }

      // x ? 1 : y   ==>   x | y
      if (matches(curr, select(ival(1), any(&y), any(&x)))) {
        return builder.makeBinary(OrInt32, y, x);
      }
    }
    {
      // Simplify x < 0 ? -1 : 1 or x >= 0 ? 1 : -1 to
      // i32(x) >> 31 | 1
      // i64(x) >> 63 | 1
      Binary* bin;
      if (matches(
            curr,
            select(ival(-1), ival(1), binary(&bin, LtS, any(), ival(0)))) ||
          matches(
            curr,
            select(ival(1), ival(-1), binary(&bin, GeS, any(), ival(0))))) {
        auto c = bin->right->cast<Const>();
        auto type = curr->ifTrue->type;
        if (type == c->type) {
          bin->type = type;
          bin->op = Abstract::getBinary(type, ShrS);
          c->value = Literal::makeFromInt32(type.getByteSize() * 8 - 1, type);
          curr->ifTrue->cast<Const>()->value = Literal::makeOne(type);
          return builder.makeBinary(
            Abstract::getBinary(type, Or), bin, curr->ifTrue);
        }
      }
    }
    {
      // Flip select to remove eqz if we can reorder
      Select* s;
      Expression *ifTrue, *ifFalse, *c;
      if (matches(
            curr,
            select(
              &s, any(&ifTrue), any(&ifFalse), unary(EqZInt32, any(&c)))) &&
          canReorder(ifTrue, ifFalse)) {
        s->ifTrue = ifFalse;
        s->ifFalse = ifTrue;
        s->condition = c;
        return s;
      }
    }
    {
      // Sides are identical, fold
      Expression *ifTrue, *ifFalse, *c;
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), any(&c))) &&
          ExpressionAnalyzer::equal(ifTrue, ifFalse)) {
        auto value = effects(ifTrue);
        if (value.hasSideEffects()) {
          // At best we don't need the condition, but need to execute the
          // value twice. a block is larger than a select by 2 bytes, and we
          // must drop one value, so 3, while we save the condition, so it's
          // not clear this is worth it, TODO
        } else {
          // The value has no side effects, so we can replace ourselves with one
          // of the two identical values in the arms.
          auto condition = effects(c);
          if (!condition.hasSideEffects()) {
            return ifTrue;
          } else {
            // The condition is last, so we need a new local, and it may be a
            // bad idea to use a block like we do for an if. Do it only if we
            // can reorder
            if (!condition.invalidates(value)) {
              return builder.makeSequence(builder.makeDrop(c), ifTrue);
            }
          }
        }
      }
    }
    return nullptr;
  }